

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void heightOfExprList(ExprList *p,int *pnHeight)

{
  int iVar1;
  int iVar2;
  ExprList_item *pEVar3;
  long lVar4;
  
  if (p != (ExprList *)0x0) {
    iVar2 = p->nExpr;
    if (0 < iVar2) {
      pEVar3 = p->a;
      lVar4 = 0;
      do {
        if ((pEVar3->pExpr != (Expr *)0x0) && (iVar1 = pEVar3->pExpr->nHeight, *pnHeight < iVar1)) {
          *pnHeight = iVar1;
          iVar2 = p->nExpr;
        }
        lVar4 = lVar4 + 1;
        pEVar3 = pEVar3 + 1;
      } while (lVar4 < iVar2);
    }
  }
  return;
}

Assistant:

static void heightOfExprList(ExprList *p, int *pnHeight){
  if( p ){
    int i;
    for(i=0; i<p->nExpr; i++){
      heightOfExpr(p->a[i].pExpr, pnHeight);
    }
  }
}